

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_crossEntropyCost(short *norm,uint accuracyLog,uint *count,uint max)

{
  int local_40;
  uint norm256;
  uint normAcc;
  uint s;
  size_t cost;
  uint shift;
  uint max_local;
  uint *count_local;
  uint accuracyLog_local;
  short *norm_local;
  
  _normAcc = 0;
  for (norm256 = 0; norm256 <= max; norm256 = norm256 + 1) {
    if (norm[norm256] == -1) {
      local_40 = 1;
    }
    else {
      local_40 = (int)norm[norm256];
    }
    _normAcc = count[norm256] *
               kInverseProbabiltyLog256[(uint)(local_40 << (8U - (char)accuracyLog & 0x1f))] +
               _normAcc;
  }
  return _normAcc >> 8;
}

Assistant:

static size_t ZSTD_crossEntropyCost(short const* norm, unsigned accuracyLog,
                                    unsigned const* count, unsigned const max)
{
    unsigned const shift = 8 - accuracyLog;
    size_t cost = 0;
    unsigned s;
    assert(accuracyLog <= 8);
    for (s = 0; s <= max; ++s) {
        unsigned const normAcc = norm[s] != -1 ? norm[s] : 1;
        unsigned const norm256 = normAcc << shift;
        assert(norm256 > 0);
        assert(norm256 < 256);
        cost += count[s] * kInverseProbabiltyLog256[norm256];
    }
    return cost >> 8;
}